

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O3

int __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<double>_>::stepToEdge
          (BitMatrixCursor<ZXing::PointT<double>_> *this,int nth,int range,bool backup)

{
  PointT<double> PVar1;
  double dVar2;
  double dVar3;
  Value VVar4;
  Value VVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  PointT<double> p;
  
  VVar4 = testAt<double>(this,this->p);
  if (nth == 0) {
    bVar7 = true;
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    do {
      bVar7 = VVar4.v != -1 && (iVar8 < range || range == 0);
      if (VVar4.v == -1 || iVar8 >= range && range != 0) break;
      iVar8 = iVar8 + 1;
      p.y = (double)iVar8 * (this->d).y + (this->p).y;
      p.x = (this->d).x * (double)iVar8 + (this->p).x;
      VVar5 = testAt<double>(this,p);
      nth = nth - (uint)(VVar4.v != VVar5.v);
      VVar4 = VVar5;
    } while (nth != 0);
  }
  dVar2 = (double)(int)(iVar8 - (uint)backup);
  dVar3 = dVar2 * (this->d).y + (this->p).y;
  PVar1.y._0_4_ = SUB84(dVar3,0);
  PVar1.x = dVar2 * (this->d).x + (this->p).x;
  PVar1.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
  this->p = PVar1;
  iVar6 = 0;
  if (bVar7) {
    iVar6 = iVar8 - (uint)backup;
  }
  return iVar6;
}

Assistant:

int stepToEdge(int nth = 1, int range = 0, bool backup = false)
	{
		int steps = 0;
		auto lv = testAt(p);

		while (nth && (!range || steps < range) && lv.isValid()) {
			++steps;
			auto v = testAt(p + steps * d);
			if (lv != v) {
				lv = v;
				--nth;
			}
		}
		if (backup)
			--steps;
		p += steps * d;
		return steps * (nth == 0);
	}